

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::Q3BSPFileParser::Q3BSPFileParser
          (Q3BSPFileParser *this,string *mapName,ZipArchiveIOSystem *pZipArchive)

{
  bool bVar1;
  Q3BSPModel *pQVar2;
  
  (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_sOffset = 0;
  (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this->m_pModel = (Q3BSPModel *)0x0;
  this->m_pZipArchive = pZipArchive;
  if (pZipArchive == (ZipArchiveIOSystem *)0x0) {
    __assert_fail("nullptr != m_pZipArchive",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                  ,0x40,
                  "Assimp::Q3BSPFileParser::Q3BSPFileParser(const std::string &, ZipArchiveIOSystem *)"
                 );
  }
  if (mapName->_M_string_length != 0) {
    bVar1 = readData(this,mapName);
    if (bVar1) {
      pQVar2 = (Q3BSPModel *)operator_new(0xe0);
      Q3BSP::Q3BSPModel::Q3BSPModel(pQVar2);
      this->m_pModel = pQVar2;
      std::__cxx11::string::_M_assign((string *)&pQVar2->m_ModelName);
      bVar1 = parseFile(this);
      if (!bVar1) {
        pQVar2 = this->m_pModel;
        if (pQVar2 != (Q3BSPModel *)0x0) {
          Q3BSP::Q3BSPModel::~Q3BSPModel(pQVar2);
          operator_delete(pQVar2,0xe0);
        }
        this->m_pModel = (Q3BSPModel *)0x0;
      }
    }
    return;
  }
  __assert_fail("!mapName.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0x41,
                "Assimp::Q3BSPFileParser::Q3BSPFileParser(const std::string &, ZipArchiveIOSystem *)"
               );
}

Assistant:

Q3BSPFileParser::Q3BSPFileParser( const std::string &mapName, ZipArchiveIOSystem *pZipArchive ) :
    m_sOffset( 0 ),
    m_Data(),
    m_pModel(nullptr),
    m_pZipArchive( pZipArchive )
{
    ai_assert(nullptr != m_pZipArchive );
    ai_assert( !mapName.empty() );

    if ( !readData( mapName ) )
        return;

    m_pModel = new Q3BSPModel;
    m_pModel->m_ModelName = mapName;
    if ( !parseFile() ) {
        delete m_pModel;
        m_pModel = nullptr;
    }
}